

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int btreeRestoreCursorPosition(BtCursor *pCur)

{
  int iVar1;
  int skipNext;
  
  skipNext = 0;
  if (pCur->eState == '\x04') {
    iVar1 = pCur->skipNext;
  }
  else {
    pCur->eState = '\x01';
    if ((sqlite3Config.xTestCallback != (_func_int_int *)0x0) &&
       (iVar1 = (*sqlite3Config.xTestCallback)(0x19a), iVar1 != 0)) {
      return 10;
    }
    iVar1 = btreeMoveto(pCur,pCur->pKey,pCur->nKey,0,&skipNext);
    if (iVar1 == 0) {
      sqlite3_free(pCur->pKey);
      pCur->pKey = (void *)0x0;
      if (skipNext == 0) {
        if (pCur->skipNext == 0) {
          return 0;
        }
      }
      else {
        pCur->skipNext = skipNext;
      }
      iVar1 = 0;
      if (pCur->eState == '\0') {
        pCur->eState = '\x02';
      }
    }
  }
  return iVar1;
}

Assistant:

static int btreeRestoreCursorPosition(BtCursor *pCur){
  int rc;
  int skipNext = 0;
  assert( cursorOwnsBtShared(pCur) );
  assert( pCur->eState>=CURSOR_REQUIRESEEK );
  if( pCur->eState==CURSOR_FAULT ){
    return pCur->skipNext;
  }
  pCur->eState = CURSOR_INVALID;
  if( sqlite3FaultSim(410) ){
    rc = SQLITE_IOERR;
  }else{
    rc = btreeMoveto(pCur, pCur->pKey, pCur->nKey, 0, &skipNext);
  }
  if( rc==SQLITE_OK ){
    sqlite3_free(pCur->pKey);
    pCur->pKey = 0;
    assert( pCur->eState==CURSOR_VALID || pCur->eState==CURSOR_INVALID );
    if( skipNext ) pCur->skipNext = skipNext;
    if( pCur->skipNext && pCur->eState==CURSOR_VALID ){
      pCur->eState = CURSOR_SKIPNEXT;
    }
  }
  return rc;
}